

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O2

bool __thiscall Gluco::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  ClauseAllocator *this_00;
  vec<unsigned_int> *elimclauses;
  vec<Gluco::Lit> *out_clause;
  ulong uVar1;
  Var VVar2;
  bool bVar3;
  uint uVar4;
  vec<unsigned_int> *pvVar5;
  ulong *puVar6;
  Clause *pCVar7;
  Clause *pCVar8;
  long lVar9;
  ulong uVar10;
  vec<unsigned_int> *pvVar11;
  vec<Gluco::Solver::Watcher> *pvVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  Var v_local;
  vec<unsigned_int> pos;
  int clause_size;
  vec<unsigned_int> neg;
  int *local_38;
  
  v_local = v;
  if ((this->frozen).data[v] != '\0') {
    __assert_fail("!frozen[v]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,0x1f1,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  if ((0 < (this->eliminated).sz) && ((this->eliminated).data[v] != '\0')) {
    __assert_fail("!isEliminated(v)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,0x1f2,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  pos.data = (uint *)CONCAT71(pos.data._1_7_,(this->super_Solver).assigns.data[v].value);
  bVar3 = lbool::operator==((lbool *)&pos,(lbool)0x2);
  if (!bVar3) {
    __assert_fail("value(v) == l_Undef",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,499,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  pvVar5 = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::lookup
                     (&this->occurs,&v_local);
  pos.data = (uint *)0x0;
  pos.sz = 0;
  pos.cap = 0;
  neg.data = (uint *)0x0;
  neg.sz = 0;
  neg.cap = 0;
  this_00 = &(this->super_Solver).ca;
  lVar9 = 0;
  do {
    if (pvVar5->sz <= lVar9) {
      clause_size = 0;
      pvVar11 = &neg;
      iVar15 = 0;
      for (lVar9 = 0; lVar9 < pos.sz; lVar9 = lVar9 + 1) {
        for (lVar16 = 0; lVar16 < neg.sz; lVar16 = lVar16 + 1) {
          pCVar7 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[]
                             (&this_00->super_RegionAllocator<unsigned_int>,pos.data[lVar9]);
          pCVar8 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[]
                             (&this_00->super_RegionAllocator<unsigned_int>,neg.data[lVar16]);
          bVar3 = merge(this,pCVar7,pCVar8,v_local,&clause_size);
          if (bVar3) {
            bVar3 = true;
            if (this->grow + pvVar5->sz <= iVar15) goto LAB_004c067e;
            iVar15 = iVar15 + 1;
            if ((this->clause_lim != -1) && (this->clause_lim < clause_size)) goto LAB_004c067e;
          }
        }
      }
      (this->eliminated).data[v_local] = '\x01';
      Solver::setDecisionVar(&this->super_Solver,v_local,false);
      this->eliminated_vars = this->eliminated_vars + 1;
      elimclauses = &this->elimclauses;
      lVar9 = 0;
      if (neg.sz < pos.sz) {
        for (; VVar2 = v_local, lVar9 < neg.sz; lVar9 = lVar9 + 1) {
          pCVar7 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[]
                             (&this_00->super_RegionAllocator<unsigned_int>,neg.data[lVar9]);
          mkElimClause(elimclauses,VVar2,pCVar7);
        }
        mkElimClause(elimclauses,(Lit)(v_local * 2));
      }
      else {
        for (; VVar2 = v_local, lVar9 < pos.sz; lVar9 = lVar9 + 1) {
          pCVar7 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[]
                             (&this_00->super_RegionAllocator<unsigned_int>,pos.data[lVar9]);
          mkElimClause(elimclauses,VVar2,pCVar7);
        }
        mkElimClause(elimclauses,(Lit)(v_local * 2 + 1));
        pvVar11 = &pos;
      }
      local_38 = &pvVar11->sz;
      this->eliminated_clauses = this->eliminated_clauses + *local_38;
      out_clause = &(this->super_Solver).add_tmp;
      for (lVar9 = 0; lVar9 < pos.sz; lVar9 = lVar9 + 1) {
        for (lVar16 = 0; lVar16 < neg.sz; lVar16 = lVar16 + 1) {
          pCVar7 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[]
                             (&this_00->super_RegionAllocator<unsigned_int>,pos.data[lVar9]);
          pCVar8 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[]
                             (&this_00->super_RegionAllocator<unsigned_int>,neg.data[lVar16]);
          bVar3 = merge(this,pCVar7,pCVar8,v_local,out_clause);
          if ((bVar3) && (bVar3 = addClause_(this,out_clause), !bVar3)) {
            bVar3 = false;
            goto LAB_004c067e;
          }
        }
      }
      for (lVar9 = 0; lVar9 < pvVar5->sz; lVar9 = lVar9 + 1) {
        removeClause(this,pvVar5->data[lVar9]);
      }
      vec<unsigned_int>::clear((this->occurs).occs.data + v_local,true);
      pvVar12 = (this->super_Solver).watches.occs.data;
      if (pvVar12[(long)v_local * 2].sz == 0) {
        vec<Gluco::Solver::Watcher>::clear(pvVar12 + (long)v_local * 2,true);
        pvVar12 = (this->super_Solver).watches.occs.data;
      }
      uVar4 = v_local * 2 | 1;
      if (pvVar12[(int)uVar4].sz == 0) {
        vec<Gluco::Solver::Watcher>::clear(pvVar12 + (int)uVar4,true);
      }
      bVar3 = backwardSubsumptionCheck(this,false);
LAB_004c067e:
      vec<unsigned_int>::~vec(&neg);
      vec<unsigned_int>::~vec(&pos);
      return bVar3;
    }
    puVar6 = (ulong *)RegionAllocator<unsigned_int>::operator[]
                                (&this_00->super_RegionAllocator<unsigned_int>,pvVar5->data[lVar9]);
    uVar1 = *puVar6;
    uVar10 = uVar1 >> 0x20;
    if ((int)(uVar1 >> 0x20) == 0 || (long)uVar1 < 0) {
      uVar10 = 0;
    }
    uVar13 = 0xffffffffffffffff;
    do {
      uVar14 = uVar10;
      if (uVar13 - uVar10 == -1) break;
      uVar14 = uVar13 + 1;
      lVar16 = uVar13 * 4;
      uVar13 = uVar14;
    } while (*(int *)((long)puVar6 + lVar16 + 0x10) != v_local * 2);
    pvVar11 = &neg;
    if ((long)uVar14 < (long)uVar1 >> 0x20) {
      pvVar11 = &pos;
    }
    vec<unsigned_int>::push(pvVar11,pvVar5->data + lVar9);
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    int i, j;
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef>& cls = occurs.lookup(v);
    vec<CRef>        pos, neg;
    for (i = 0; i < cls.size(); i++)
        (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt         = 0;
    int clause_size = 0;

    for (i = 0; i < pos.size(); i++)
        for (j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) && 
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;

    // Delete and store old clauses:
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()){
        for (i = 0; i < neg.size(); i++)
            mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
        eliminated_clauses += neg.size();
    }else{
        for (i = 0; i < pos.size(); i++)
            mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
        eliminated_clauses += pos.size();
    }


    // Produce clauses in cross product:
    vec<Lit>& resolvent = add_tmp;
    for (i = 0; i < pos.size(); i++)
        for (j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent))
                return false;

    for (i = 0; i < cls.size(); i++)
        removeClause(cls[i]);

    // Free occurs list for this variable:
    occurs[v].clear(true);

    // Free watchers lists for this variable, if possible:
    if (watches[ mkLit(v)].size() == 0) watches[ mkLit(v)].clear(true);
    if (watches[~mkLit(v)].size() == 0) watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}